

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmac.cpp
# Opt level: O0

void VHASH_PADDED_64(void *key,int len,uint64_t seed,void *res)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  uint64_t *in_RCX;
  uint in_ESI;
  long in_RDI;
  uint64_t tagl_1;
  uint64_t tagl;
  int bytesRemaining16aligned;
  int bytesRemaining;
  uchar lastBlock [144];
  int alignedLn;
  int blcCnt;
  undefined1 local_b8 [8];
  vmac_ctx_t *in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff5c;
  uchar *in_stack_ffffffffffffff60;
  
  if ((in_ESI & 0xf) == 0) {
    uVar3 = vhash((uchar *)lastBlock._64_8_,lastBlock._60_4_,(uint64_t *)lastBlock._48_8_,
                  (vmac_ctx_t *)lastBlock._40_8_);
    *in_RCX = uVar3;
  }
  else {
    iVar1 = ((int)in_ESI / 0x80) * 0x80;
    if (iVar1 != 0) {
      vhash_update(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50);
    }
    iVar2 = (int)in_ESI % 0x80;
    memcpy(local_b8,(void *)(in_RDI + iVar1),(long)iVar2);
    memset(local_b8 + iVar2,0,(long)(((iVar2 >> 4) * 0x10 + 0x10) - iVar2));
    uVar3 = vhash((uchar *)lastBlock._64_8_,lastBlock._60_4_,(uint64_t *)lastBlock._48_8_,
                  (vmac_ctx_t *)lastBlock._40_8_);
    *in_RCX = uVar3;
  }
  return;
}

Assistant:

void VHASH_PADDED_64( const void * key, int len, uint64_t seed, void * res )
{
	(void) seed; //unused
	if (len & 0xF)
	{
		int blcCnt = len / VMAC_NHBYTES;
		int alignedLn = blcCnt * VMAC_NHBYTES;

		if (alignedLn) 
			vhash_update((unsigned char*)key, alignedLn, &(vhi.ctx));

		ALIGN(16) unsigned char lastBlock[VMAC_NHBYTES + 16];
		int bytesRemaining = len - alignedLn;
		memcpy(lastBlock, (unsigned char*)key + alignedLn, bytesRemaining);
		int bytesRemaining16aligned = ( ( bytesRemaining >> 4) << 4 ) + 16;
		memset(lastBlock + bytesRemaining, 0, bytesRemaining16aligned - bytesRemaining );

		uint64_t tagl;
#if (VMAC_TAG_LEN == 128)
		*(uint64_t*)res = vhash((unsigned char *)lastBlock, bytesRemaining, &tagl, &(vhi.ctx));
#elif (VMAC_TAG_LEN == 64)
		*(uint64_t*)res = vhash((unsigned char *)lastBlock, bytesRemaining, &tagl, &(vhi.ctx));
#else
#error VMAC_TAG_LEN could be either 64 or 128
#endif
	}
	else // size is a multiple of 16
	{
		uint64_t tagl;
#if (VMAC_TAG_LEN == 128)
		*(uint64_t*)res = vhash((unsigned char *)lastBlock, bytesRemaining + 1, &tagl, &(vhi.ctx));
#elif (VMAC_TAG_LEN == 64)
		*(uint64_t*)res = vhash((unsigned char *)key, len, &tagl, &(vhi.ctx));
#else
#error VMAC_TAG_LEN could be either 64 or 128
#endif
	}
//	vhash_abort(&(vhi.ctx));
}